

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.cpp
# Opt level: O1

uint64_t __thiscall pager::append_page(pager *this)

{
  bool bVar1;
  uint32_t lastVal;
  int iVar2;
  runtime_error *this_00;
  
  do {
    lastVal = _read_nblocks(this);
    iVar2 = fileno((FILE *)(this->_f)._f);
    iVar2 = ftruncate(iVar2,(ulong)(lastVal + 1) << 0xc);
    if (iVar2 != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"ftruncate failed");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = _update_nblocks(this,lastVal,lastVal + 1);
  } while (!bVar1);
  return (ulong)lastVal << 0xc;
}

Assistant:

uint64_t pager::append_page() const
{
    uint32_t lastNBlocks;

    // The idea here is that we want to append space for 1 block to the end of the file and update our
    // nblocks field in the special block at the beginning of the file. We'd also like to return the file
    // offset of the new blocks.
    //
    // To keep this lock free I'm calling _update_nblocks() (which uses the gcc compiler intrinsic for
    // compare and swap).

    do {
        lastNBlocks = _read_nblocks();
        auto err = ftruncate(fileno(_f), ((lastNBlocks+1)*pager::block_size()));
        if(err != 0)
            throw std::runtime_error("ftruncate failed");
    } while(!_update_nblocks(lastNBlocks, lastNBlocks+1));
    
    //return pager::block_size() + (lastNBlocks * pager::block_size());
    return lastNBlocks * pager::block_size();
}